

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bc7enc.c
# Opt level: O3

uint64_t evaluate_solution(color_quad_u8 *pLow,color_quad_u8 *pHigh,uint32_t *pbits,
                          color_cell_compressor_params *pParams,
                          color_cell_compressor_results *pResults)

{
  bc7enc_bool bVar1;
  uint32_t *puVar2;
  color_quad_u8 *pcVar3;
  char cVar4;
  byte bVar8;
  byte bVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  uint uVar14;
  undefined1 auVar15 [13];
  undefined1 auVar16 [13];
  undefined1 auVar17 [13];
  undefined1 auVar18 [13];
  undefined1 auVar19 [13];
  undefined1 auVar20 [13];
  uint5 uVar21;
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [13];
  undefined1 auVar25 [13];
  uint uVar26;
  uint64_t uVar27;
  void *pvVar28;
  uint uVar29;
  int iVar30;
  ulong uVar31;
  int iVar32;
  ulong uVar33;
  uint32_t j;
  long lVar34;
  ulong uVar35;
  uint uVar36;
  undefined1 *puVar37;
  int iVar38;
  uint uVar39;
  color_cell_compressor_results *pcVar40;
  ulong uVar41;
  int iVar42;
  int iVar43;
  ulong uVar44;
  uint8_t uVar45;
  undefined4 uVar46;
  uint uVar47;
  int iVar48;
  color_cell_compressor_params *pcVar49;
  uint32_t uVar50;
  uint uVar51;
  uint uVar52;
  ulong uVar53;
  bool bVar54;
  short sVar55;
  uint3 uVar56;
  uint uVar57;
  uint3 uVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  byte bVar62;
  undefined4 local_a8;
  undefined4 local_a4;
  color_cell_compressor_params *local_a0;
  color_cell_compressor_results *local_98;
  int local_90;
  undefined4 local_8c;
  undefined4 local_88;
  undefined1 local_84 [52];
  color_quad_u8 actualMaxColor;
  color_quad_u8 actualMinColor;
  char cVar5;
  char cVar6;
  char cVar7;
  byte bVar9;
  undefined6 uVar58;
  
  uVar52 = *(uint *)pLow->m_c;
  uVar26 = *(uint *)pHigh->m_c;
  if (pParams->m_has_pbits != '\0') {
    uVar29 = *pbits;
    uVar50 = uVar29;
    if (pParams->m_endpoints_share_pbit == '\0') {
      uVar50 = pbits[1];
    }
    uVar52 = (uVar52 >> 0x17 & 0xfe | uVar29) << 0x18 |
             (uVar52 >> 0xf & 0xfe | uVar29 & 0xff) << 0x10 |
             (uVar52 >> 7 & 0xfe | uVar29 & 0xff) << 8 | (uVar52 * 2 | uVar29) & 0xff;
    uVar26 = (uVar26 >> 0x17 & 0xfe | uVar50) << 0x18 |
             (uVar26 >> 0xf & 0xfe | uVar50 & 0xff) << 0x10 |
             (uVar26 >> 7 & 0xfe | uVar50 & 0xff) << 8 | (uVar26 * 2 | uVar50) & 0xff;
  }
  uVar29 = (pParams->m_comp_bits + 1) - (uint)(pParams->m_has_pbits == '\0');
  iVar32 = 8 - uVar29;
  auVar15[0xc] = (char)(uVar52 >> 0x18);
  auVar15._0_12_ = ZEXT712(0);
  uVar21 = CONCAT32(auVar15._10_3_,(ushort)(byte)(uVar52 >> 0x10));
  auVar25._5_8_ = 0;
  auVar25._0_5_ = uVar21;
  uVar57 = (uVar52 & 0xff) << iVar32;
  uVar52 = (uint)CONCAT72(SUB137(auVar25 << 0x40,6),(ushort)(byte)(uVar52 >> 8));
  auVar22._4_4_ = uVar52;
  auVar22._0_4_ = uVar57;
  uVar36 = (uint)uVar21;
  uVar56 = auVar15._10_3_ >> 0x10;
  auVar22._8_4_ = uVar36;
  auVar22._12_3_ = uVar56;
  uVar31 = (ulong)uVar29;
  auVar23._4_4_ = uVar52 >> uVar31;
  auVar23._0_4_ = uVar57 >> uVar31;
  auVar23._8_4_ = uVar36 >> uVar31;
  auVar23._12_3_ = uVar56 >> uVar31;
  auVar60[0xf] = 0;
  auVar60._0_15_ = auVar23 | auVar22;
  auVar60 = auVar60 & _DAT_00121050;
  sVar11 = auVar60._0_2_;
  cVar4 = (0 < sVar11) * (sVar11 < 0x100) * auVar60[0] - (0xff < sVar11);
  sVar11 = auVar60._2_2_;
  sVar55 = CONCAT11((0 < sVar11) * (sVar11 < 0x100) * auVar60[2] - (0xff < sVar11),cVar4);
  sVar11 = auVar60._4_2_;
  cVar5 = (0 < sVar11) * (sVar11 < 0x100) * auVar60[4] - (0xff < sVar11);
  sVar11 = auVar60._6_2_;
  uVar46 = CONCAT13((0 < sVar11) * (sVar11 < 0x100) * auVar60[6] - (0xff < sVar11),
                    CONCAT12(cVar5,sVar55));
  sVar11 = auVar60._8_2_;
  cVar6 = (0 < sVar11) * (sVar11 < 0x100) * auVar60[8] - (0xff < sVar11);
  sVar11 = auVar60._10_2_;
  uVar58 = CONCAT15((0 < sVar11) * (sVar11 < 0x100) * auVar60[10] - (0xff < sVar11),
                    CONCAT14(cVar6,uVar46));
  sVar11 = auVar60._12_2_;
  cVar7 = (0 < sVar11) * (sVar11 < 0x100) * auVar60[0xc] - (0xff < sVar11);
  sVar13 = auVar60._14_2_;
  bVar62 = (byte)(uVar26 >> 0x18);
  uVar44 = (ulong)(ushort)uVar26 & 0xffffffffffff00ff;
  auVar16._8_4_ = 0;
  auVar16._0_8_ = uVar44;
  auVar16[0xc] = bVar62;
  auVar17[8] = (char)(uVar26 >> 0x10);
  auVar17._0_8_ = uVar44;
  auVar17[9] = 0;
  auVar17._10_3_ = auVar16._10_3_;
  auVar24._5_8_ = 0;
  auVar24._0_5_ = auVar17._8_5_;
  auVar18[4] = (char)(uVar26 >> 8);
  auVar18._0_4_ = (int)uVar44;
  auVar18[5] = 0;
  auVar18._6_7_ = SUB137(auVar24 << 0x40,6);
  uVar52 = (int)uVar44 << iVar32;
  auVar19._4_4_ = auVar18._4_4_;
  auVar19._0_4_ = uVar52;
  auVar19._8_4_ = auVar17._8_4_;
  auVar19[0xc] = bVar62;
  sVar11 = (short)((uint)uVar46 >> 0x10);
  sVar12 = (short)((uint6)uVar58 >> 0x20);
  bVar8 = (0 < sVar12) * (sVar12 < 0x100) * cVar6 - (0xff < sVar12);
  uVar59 = CONCAT12(bVar8,CONCAT11((0 < sVar11) * (sVar11 < 0x100) * cVar5 - (0xff < sVar11),
                                   (0 < sVar55) * (sVar55 < 0x100) * cVar4 - (0xff < sVar55)));
  sVar11 = (short)(CONCAT17((0 < sVar13) * (sVar13 < 0x100) * auVar60[0xe] - (0xff < sVar13),
                            CONCAT16(cVar7,uVar58)) >> 0x30);
  bVar9 = (0 < sVar11) * (sVar11 < 0x100) * cVar7 - (0xff < sVar11);
  local_a4 = CONCAT13(bVar9,uVar59);
  auVar20._4_4_ = auVar18._4_4_ >> uVar31;
  auVar20._0_4_ = uVar52 >> uVar31;
  auVar20._8_4_ = auVar17._8_4_ >> uVar31;
  auVar20[0xc] = bVar62 >> uVar31;
  auVar61._13_3_ = 0;
  auVar61._0_13_ = auVar20 | auVar19;
  auVar61 = _DAT_00121050 & auVar61;
  sVar11 = auVar61._0_2_;
  cVar4 = (0 < sVar11) * (sVar11 < 0x100) * auVar61[0] - (0xff < sVar11);
  sVar11 = auVar61._2_2_;
  sVar55 = CONCAT11((0 < sVar11) * (sVar11 < 0x100) * auVar61[2] - (0xff < sVar11),cVar4);
  sVar11 = auVar61._4_2_;
  cVar5 = (0 < sVar11) * (sVar11 < 0x100) * auVar61[4] - (0xff < sVar11);
  sVar11 = auVar61._6_2_;
  uVar46 = CONCAT13((0 < sVar11) * (sVar11 < 0x100) * auVar61[6] - (0xff < sVar11),
                    CONCAT12(cVar5,sVar55));
  sVar11 = auVar61._8_2_;
  cVar6 = (0 < sVar11) * (sVar11 < 0x100) * auVar61[8] - (0xff < sVar11);
  sVar11 = auVar61._10_2_;
  uVar58 = CONCAT15((0 < sVar11) * (sVar11 < 0x100) * auVar61[10] - (0xff < sVar11),
                    CONCAT14(cVar6,uVar46));
  sVar11 = auVar61._12_2_;
  cVar7 = (0 < sVar11) * (sVar11 < 0x100) * auVar61[0xc] - (0xff < sVar11);
  sVar13 = auVar61._14_2_;
  sVar11 = (short)((uint)uVar46 >> 0x10);
  sVar12 = (short)((uint6)uVar58 >> 0x20);
  bVar62 = (0 < sVar12) * (sVar12 < 0x100) * cVar6 - (0xff < sVar12);
  uVar56 = CONCAT12(bVar62,CONCAT11((0 < sVar11) * (sVar11 < 0x100) * cVar5 - (0xff < sVar11),
                                    (0 < sVar55) * (sVar55 < 0x100) * cVar4 - (0xff < sVar55)));
  sVar11 = (short)(CONCAT17((0 < sVar13) * (sVar13 < 0x100) * auVar61[0xe] - (0xff < sVar13),
                            CONCAT16(cVar7,uVar58)) >> 0x30);
  bVar10 = (0 < sVar11) * (sVar11 < 0x100) * cVar7 - (0xff < sVar11);
  local_a8 = CONCAT13(bVar10,uVar56);
  uVar44 = (ulong)pParams->m_num_selector_weights;
  local_88 = local_a4;
  uVar52 = pParams->m_num_selector_weights - 1;
  *(undefined4 *)(local_84 + (ulong)uVar52 * 4 + -4) = local_a8;
  bVar1 = pParams->m_has_alpha;
  uVar27 = (uint64_t)CONCAT31((int3)(uVar26 >> 8),bVar1);
  local_98 = pResults;
  if (uVar52 < 2) {
    uVar29 = SUB154(auVar23 | auVar22,0);
    uVar26 = SUB134(auVar20 | auVar19,0);
    pcVar40 = pResults;
  }
  else {
    puVar2 = pParams->m_pSelector_weights;
    uVar31 = 1;
    puVar37 = local_84;
    do {
      uVar50 = puVar2[uVar31];
      lVar34 = 0;
      do {
        puVar37[lVar34] =
             (char)((uint)*(byte *)((long)&local_a4 + lVar34) * (0x40 - uVar50) +
                    *(byte *)((long)&local_a8 + lVar34) * uVar50 + 0x20 >> 6);
        lVar34 = lVar34 + 1;
      } while (4 - (ulong)(bVar1 == '\0') != lVar34);
      uVar31 = uVar31 + 1;
      puVar37 = puVar37 + 4;
    } while (uVar31 != uVar52);
    uVar29 = uVar59 & 0xff;
    uVar26 = uVar56 & 0xff;
    pcVar40 = local_98;
  }
  local_a0 = pParams;
  if (pParams->m_perceptual == '\0') {
    uVar29 = uVar29 & 0xff;
    uVar57 = (uVar59 & 0xff00) >> 8;
    uVar36 = (uint)bVar8;
    iVar32 = (uVar26 & 0xff) - uVar29;
    iVar43 = ((uVar56 & 0xff00) >> 8) - uVar57;
    iVar30 = bVar62 - uVar36;
    if (bVar1 == '\0') {
      if (pParams->m_num_pixels != 0) {
        uVar31 = 0;
        uVar53 = 0;
        do {
          pcVar3 = pParams->m_pPixels;
          bVar8 = pcVar3[uVar31].m_c[0];
          bVar9 = pcVar3[uVar31].m_c[1];
          bVar62 = pcVar3[uVar31].m_c[2];
          uVar39 = (uint)((float)(int)((bVar62 - uVar36) * iVar30 +
                                      (bVar9 - uVar57) * iVar43 + (bVar8 - uVar29) * iVar32) *
                          ((float)uVar44 /
                          ((float)(iVar30 * iVar30 + iVar43 * iVar43 + iVar32 * iVar32) + 1.25e-06))
                         + 0.5);
          uVar26 = uVar39;
          if ((int)uVar52 <= (int)uVar39) {
            uVar26 = uVar52;
          }
          uVar47 = 1;
          if (0 < (int)uVar39) {
            uVar47 = uVar26;
          }
          lVar34 = (long)(int)uVar47;
          iVar38 = (uint)*(byte *)((long)&local_8c + lVar34 * 4 + 1) - (uint)bVar9;
          iVar42 = (uint)*(byte *)((long)&local_8c + lVar34 * 4 + 2) - (uint)bVar62;
          uVar39 = iVar42 * iVar42 * pParams->m_weights[2] +
                   iVar38 * iVar38 * pParams->m_weights[1] +
                   ((uint)*(byte *)(&local_8c + lVar34) - (uint)bVar8) *
                   ((uint)*(byte *)(&local_8c + lVar34) - (uint)bVar8) * pParams->m_weights[0];
          iVar38 = (uint)(byte)local_84[lVar34 * 4 + -4] - (uint)bVar8;
          uVar51 = pParams->m_weights[2] * ((uint)(byte)local_84[lVar34 * 4 + -2] - (uint)bVar62) *
                   ((uint)(byte)local_84[lVar34 * 4 + -2] - (uint)bVar62) +
                   pParams->m_weights[1] * ((uint)(byte)local_84[lVar34 * 4 + -3] - (uint)bVar9) *
                   ((uint)(byte)local_84[lVar34 * 4 + -3] - (uint)bVar9) +
                   pParams->m_weights[0] * iVar38 * iVar38;
          uVar26 = uVar51;
          if (uVar39 < uVar51) {
            uVar26 = uVar39;
          }
          uVar14 = uVar47 - 1 & 0xff;
          if (uVar39 >= uVar51) {
            uVar14 = uVar47;
          }
          uVar53 = uVar53 + uVar26;
          pcVar40->m_pSelectors_temp[uVar31] = (uint8_t)uVar14;
          uVar31 = uVar31 + 1;
          uVar27 = (uint64_t)pParams->m_num_pixels;
          pResults = pcVar40;
        } while (uVar31 < uVar27);
        goto LAB_0010a307;
      }
    }
    else if (pParams->m_num_pixels != 0) {
      local_8c = (uint)bVar9;
      local_90 = bVar10 - local_8c;
      uVar31 = 0;
      uVar53 = 0;
      pcVar49 = pParams;
      do {
        pcVar3 = pcVar49->m_pPixels;
        bVar8 = pcVar3[uVar31].m_c[0];
        bVar9 = pcVar3[uVar31].m_c[1];
        bVar62 = pcVar3[uVar31].m_c[2];
        bVar10 = pcVar3[uVar31].m_c[3];
        uVar39 = (uint)((float)(int)((bVar10 - local_8c) * local_90 + (bVar62 - uVar36) * iVar30 +
                                    (bVar9 - uVar57) * iVar43 + (bVar8 - uVar29) * iVar32) *
                        ((float)uVar44 /
                        ((float)(local_90 * local_90 + iVar30 * iVar30 +
                                iVar43 * iVar43 + iVar32 * iVar32) + 1.25e-06)) + 0.5);
        uVar26 = uVar39;
        if ((int)uVar52 <= (int)uVar39) {
          uVar26 = uVar52;
        }
        uVar47 = 1;
        if (0 < (int)uVar39) {
          uVar47 = uVar26;
        }
        lVar34 = (long)(int)uVar47;
        iVar42 = (uint)*(byte *)((long)&local_8c + lVar34 * 4 + 1) - (uint)bVar9;
        iVar38 = (uint)*(byte *)((long)&local_8c + lVar34 * 4 + 2) - (uint)bVar62;
        iVar48 = (uint)*(byte *)((long)&local_8c + lVar34 * 4 + 3) - (uint)bVar10;
        uVar33 = (ulong)(iVar48 * iVar48 * pParams->m_weights[3]) +
                 (ulong)(iVar38 * iVar38 * pParams->m_weights[2] +
                        iVar42 * iVar42 * pcVar49->m_weights[1] +
                        ((uint)*(byte *)(&local_8c + lVar34) - (uint)bVar8) *
                        ((uint)*(byte *)(&local_8c + lVar34) - (uint)bVar8) * pcVar49->m_weights[0])
        ;
        iVar38 = (uint)(byte)local_84[lVar34 * 4 + -4] - (uint)bVar8;
        uVar35 = (ulong)(pParams->m_weights[3] *
                         ((uint)(byte)local_84[lVar34 * 4 + -1] - (uint)bVar10) *
                        ((uint)(byte)local_84[lVar34 * 4 + -1] - (uint)bVar10)) +
                 (ulong)(pParams->m_weights[2] *
                         ((uint)(byte)local_84[lVar34 * 4 + -2] - (uint)bVar62) *
                         ((uint)(byte)local_84[lVar34 * 4 + -2] - (uint)bVar62) +
                        pcVar49->m_weights[1] *
                        ((uint)(byte)local_84[lVar34 * 4 + -3] - (uint)bVar9) *
                        ((uint)(byte)local_84[lVar34 * 4 + -3] - (uint)bVar9) +
                        pcVar49->m_weights[0] * iVar38 * iVar38);
        uVar26 = uVar47 - 1 & 0xff;
        if (uVar35 <= uVar33) {
          uVar26 = uVar47;
        }
        pResults->m_pSelectors_temp[uVar31] = (uint8_t)uVar26;
        if (uVar33 <= uVar35) {
          uVar35 = uVar33;
        }
        uVar53 = uVar53 + uVar35;
        uVar31 = uVar31 + 1;
        uVar27 = (uint64_t)pParams->m_num_pixels;
        pcVar49 = local_a0;
      } while (uVar31 < uVar27);
      goto LAB_0010a307;
    }
  }
  else if (pParams->m_num_pixels != 0) {
    uVar31 = 0;
    uVar53 = 0;
    pcVar49 = pParams;
    do {
      if (pcVar49->m_has_alpha == '\0') {
        if (uVar44 == 0) goto LAB_00109f49;
        pcVar3 = pcVar49->m_pPixels;
        iVar32 = (uint)pcVar3[uVar31].m_c[2] * 0x25 +
                 (uint)pcVar3[uVar31].m_c[1] * 0x16e + (uint)pcVar3[uVar31].m_c[0] * 0x6d;
        uVar35 = 0xffffffffffffffff;
        uVar33 = 0;
        uVar46 = 0;
        do {
          iVar30 = (uint)(byte)local_84[uVar33 * 4 + -2] * 0x25 +
                   (uint)(byte)local_84[uVar33 * 4 + -3] * 0x16e +
                   (uint)(byte)local_84[uVar33 * 4 + -4] * 0x6d;
          iVar38 = iVar30 - iVar32 >> 8;
          iVar43 = (int)((((uint)(byte)local_84[uVar33 * 4 + -4] - (uint)pcVar3[uVar31].m_c[0]) *
                          0x200 - iVar30) + iVar32) >> 8;
          iVar30 = (int)(((uint)(byte)local_84[uVar33 * 4 + -2] * 0x200 -
                         (iVar30 + (uint)pcVar3[uVar31].m_c[2] * 0x200)) + iVar32) >> 8;
          uVar41 = (ulong)(iVar30 * pcVar49->m_weights[2] * iVar30 +
                          iVar43 * pcVar49->m_weights[1] * iVar43 +
                          iVar38 * pcVar49->m_weights[0] * iVar38);
          if (uVar41 < uVar35) {
            uVar46 = (int)uVar33;
          }
          uVar45 = (uint8_t)uVar46;
          if (uVar41 <= uVar35) {
            uVar35 = uVar41;
          }
          uVar33 = uVar33 + 1;
        } while (uVar44 != uVar33);
      }
      else if (uVar44 == 0) {
LAB_00109f49:
        uVar45 = '\0';
        uVar35 = 0xffffffffffffffff;
      }
      else {
        pcVar3 = pcVar49->m_pPixels;
        iVar32 = (uint)pcVar3[uVar31].m_c[2] * 0x25 +
                 (uint)pcVar3[uVar31].m_c[1] * 0x16e + (uint)pcVar3[uVar31].m_c[0] * 0x6d;
        uVar35 = 0xffffffffffffffff;
        uVar33 = 0;
        uVar46 = 0;
        do {
          iVar43 = (uint)(byte)local_84[uVar33 * 4 + -2] * 0x25 +
                   (uint)(byte)local_84[uVar33 * 4 + -3] * 0x16e +
                   (uint)(byte)local_84[uVar33 * 4 + -4] * 0x6d;
          iVar42 = iVar43 - iVar32 >> 8;
          iVar30 = (int)((((uint)(byte)local_84[uVar33 * 4 + -4] - (uint)pcVar3[uVar31].m_c[0]) *
                          0x200 - iVar43) + iVar32) >> 8;
          iVar43 = (int)(((uint)(byte)local_84[uVar33 * 4 + -2] * 0x200 -
                         (iVar43 + (uint)pcVar3[uVar31].m_c[2] * 0x200)) + iVar32) >> 8;
          iVar38 = (uint)(byte)local_84[uVar33 * 4 + -1] - (uint)pcVar3[uVar31].m_c[3];
          uVar41 = (ulong)(iVar38 * iVar38 * pcVar49->m_weights[3]) +
                   (ulong)(iVar43 * pcVar49->m_weights[2] * iVar43 +
                          iVar30 * pcVar49->m_weights[1] * iVar30 +
                          iVar42 * pcVar49->m_weights[0] * iVar42);
          bVar54 = uVar41 < uVar35;
          if (bVar54) {
            uVar35 = uVar41;
          }
          if (bVar54) {
            uVar46 = (int)uVar33;
          }
          uVar45 = (uint8_t)uVar46;
          uVar33 = uVar33 + 1;
        } while (uVar44 != uVar33);
      }
      uVar53 = uVar53 + uVar35;
      pResults->m_pSelectors_temp[uVar31] = uVar45;
      uVar31 = uVar31 + 1;
      uVar27 = (uint64_t)pParams->m_num_pixels;
      pcVar49 = local_a0;
    } while (uVar31 < uVar27);
    goto LAB_0010a307;
  }
  uVar53 = 0;
  pResults = pcVar40;
LAB_0010a307:
  if (pResults->m_best_overall_err <= uVar53) {
    return uVar27;
  }
  pResults->m_best_overall_err = uVar53;
  *(undefined4 *)(pResults->m_low_endpoint).m_c = *(undefined4 *)pLow->m_c;
  *(undefined4 *)(pResults->m_high_endpoint).m_c = *(undefined4 *)pHigh->m_c;
  pResults->m_pbits[0] = *pbits;
  pResults->m_pbits[1] = pbits[1];
  pvVar28 = memcpy(pResults->m_pSelectors,pResults->m_pSelectors_temp,(ulong)pParams->m_num_pixels);
  return (uint64_t)pvVar28;
}

Assistant:

static uint64_t evaluate_solution(const color_quad_u8 *pLow, const color_quad_u8 *pHigh, const uint32_t pbits[2], const color_cell_compressor_params *pParams, color_cell_compressor_results *pResults)
{
	color_quad_u8 quantMinColor = *pLow;
	color_quad_u8 quantMaxColor = *pHigh;

	if (pParams->m_has_pbits)
	{
		uint32_t minPBit, maxPBit;

		if (pParams->m_endpoints_share_pbit)
			maxPBit = minPBit = pbits[0];
		else
		{
			minPBit = pbits[0];
			maxPBit = pbits[1];
		}

		quantMinColor.m_c[0] = (uint8_t)((pLow->m_c[0] << 1) | minPBit);
		quantMinColor.m_c[1] = (uint8_t)((pLow->m_c[1] << 1) | minPBit);
		quantMinColor.m_c[2] = (uint8_t)((pLow->m_c[2] << 1) | minPBit);
		quantMinColor.m_c[3] = (uint8_t)((pLow->m_c[3] << 1) | minPBit);

		quantMaxColor.m_c[0] = (uint8_t)((pHigh->m_c[0] << 1) | maxPBit);
		quantMaxColor.m_c[1] = (uint8_t)((pHigh->m_c[1] << 1) | maxPBit);
		quantMaxColor.m_c[2] = (uint8_t)((pHigh->m_c[2] << 1) | maxPBit);
		quantMaxColor.m_c[3] = (uint8_t)((pHigh->m_c[3] << 1) | maxPBit);
	}

	color_quad_u8 actualMinColor = scale_color(&quantMinColor, pParams);
	color_quad_u8 actualMaxColor = scale_color(&quantMaxColor, pParams);

	const uint32_t N = pParams->m_num_selector_weights;

	color_quad_u8 weightedColors[16];
	weightedColors[0] = actualMinColor;
	weightedColors[N - 1] = actualMaxColor;

	const uint32_t nc = pParams->m_has_alpha ? 4 : 3;
	for (uint32_t i = 1; i < (N - 1); i++)
		for (uint32_t j = 0; j < nc; j++)
			weightedColors[i].m_c[j] = (uint8_t)((actualMinColor.m_c[j] * (64 - pParams->m_pSelector_weights[i]) + actualMaxColor.m_c[j] * pParams->m_pSelector_weights[i] + 32) >> 6);

	const int lr = actualMinColor.m_c[0];
	const int lg = actualMinColor.m_c[1];
	const int lb = actualMinColor.m_c[2];
	const int dr = actualMaxColor.m_c[0] - lr;
	const int dg = actualMaxColor.m_c[1] - lg;
	const int db = actualMaxColor.m_c[2] - lb;
	
	uint64_t total_err = 0;
	
	if (!pParams->m_perceptual)
	{
		if (pParams->m_has_alpha)
		{
			const int la = actualMinColor.m_c[3];
			const int da = actualMaxColor.m_c[3] - la;

			const float f = N / (float)(squarei(dr) + squarei(dg) + squarei(db) + squarei(da) + .00000125f);

			for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
			{
				const color_quad_u8 *pC = &pParams->m_pPixels[i];
				int r = pC->m_c[0];
				int g = pC->m_c[1];
				int b = pC->m_c[2];
				int a = pC->m_c[3];

				int best_sel = (int)((float)((r - lr) * dr + (g - lg) * dg + (b - lb) * db + (a - la) * da) * f + .5f);
				best_sel = clampi(best_sel, 1, N - 1);

				uint64_t err0 = compute_color_distance_rgba(&weightedColors[best_sel - 1], pC, BC7ENC_FALSE, pParams->m_weights);
				uint64_t err1 = compute_color_distance_rgba(&weightedColors[best_sel], pC, BC7ENC_FALSE, pParams->m_weights);

				if (err1 > err0)
				{
					err1 = err0;
					--best_sel;
				}
				total_err += err1;

				pResults->m_pSelectors_temp[i] = (uint8_t)best_sel;
			}
		}
		else
		{
			const float f = N / (float)(squarei(dr) + squarei(dg) + squarei(db) + .00000125f);

			for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
			{
				const color_quad_u8 *pC = &pParams->m_pPixels[i];
				int r = pC->m_c[0];
				int g = pC->m_c[1];
				int b = pC->m_c[2];

				int sel = (int)((float)((r - lr) * dr + (g - lg) * dg + (b - lb) * db) * f + .5f);
				sel = clampi(sel, 1, N - 1);

				uint64_t err0 = compute_color_distance_rgb(&weightedColors[sel - 1], pC, BC7ENC_FALSE, pParams->m_weights);
				uint64_t err1 = compute_color_distance_rgb(&weightedColors[sel], pC, BC7ENC_FALSE, pParams->m_weights);

				int best_sel = sel;
				uint64_t best_err = err1;
				if (err0 < best_err)
				{
					best_err = err0;
					best_sel = sel - 1;
				}

				total_err += best_err;

				pResults->m_pSelectors_temp[i] = (uint8_t)best_sel;
			}
		}
	}
	else
	{
		// TODO: This could be improved.
		for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
		{
			uint64_t best_err = UINT64_MAX;
			uint32_t best_sel = 0;

			if (pParams->m_has_alpha)
			{
				for (uint32_t j = 0; j < N; j++)
				{
					uint64_t err = compute_color_distance_rgba(&weightedColors[j], &pParams->m_pPixels[i], BC7ENC_TRUE, pParams->m_weights);
					if (err < best_err)
					{
						best_err = err;
						best_sel = j;
					}
				}
			}
			else
			{
				for (uint32_t j = 0; j < N; j++)
				{
					uint64_t err = compute_color_distance_rgb(&weightedColors[j], &pParams->m_pPixels[i], BC7ENC_TRUE, pParams->m_weights);
					if (err < best_err)
					{
						best_err = err;
						best_sel = j;
					}
				}
			}

			total_err += best_err;

			pResults->m_pSelectors_temp[i] = (uint8_t)best_sel;
		}
	}

	if (total_err < pResults->m_best_overall_err)
	{
		pResults->m_best_overall_err = total_err;

		pResults->m_low_endpoint = *pLow;
		pResults->m_high_endpoint = *pHigh;

		pResults->m_pbits[0] = pbits[0];
		pResults->m_pbits[1] = pbits[1];

		memcpy(pResults->m_pSelectors, pResults->m_pSelectors_temp, sizeof(pResults->m_pSelectors[0]) * pParams->m_num_pixels);
	}
				
	return total_err;
}